

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert.h
# Opt level: O2

void ut::
     are_equal<agge::tests::mocks::coords_pair<float>,2ul,std::vector<agge::tests::mocks::coords_pair<float>,std::allocator<agge::tests::mocks::coords_pair<float>>>>
               (coords_pair<float> (*expected) [2],
               vector<agge::tests::mocks::coords_pair<float>,_std::allocator<agge::tests::mocks::coords_pair<float>_>_>
               *actual,LocationInfo *location)

{
  bool value;
  unsigned_long local_28 [2];
  
  local_28[1] = 2;
  local_28[0] = (long)(actual->
                      super__Vector_base<agge::tests::mocks::coords_pair<float>,_std::allocator<agge::tests::mocks::coords_pair<float>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(actual->
                      super__Vector_base<agge::tests::mocks::coords_pair<float>,_std::allocator<agge::tests::mocks::coords_pair<float>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 4;
  are_equal<unsigned_long,unsigned_long>(local_28 + 1,local_28,location);
  value = std::__equal<false>::
          equal<agge::tests::mocks::coords_pair<float>*,agge::tests::mocks::coords_pair<float>const*>
                    (*expected,expected[1],
                     (actual->
                     super__Vector_base<agge::tests::mocks::coords_pair<float>,_std::allocator<agge::tests::mocks::coords_pair<float>_>_>
                     )._M_impl.super__Vector_impl_data._M_start);
  is_true(value,location);
  return;
}

Assistant:

inline void are_equal(T (&expected)[n], const ContainerT &actual, const LocationInfo &location)
	{
		are_equal(n, static_cast<size_t>(std::distance(actual.begin(), actual.end())), location);
		is_true(std::equal(expected, expected + n, actual.begin()), location);
	}